

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O3

void cleanup_regions(REGIONS *regions,int *num_regions)

{
  uint in_EAX;
  int iVar1;
  uint uVar2;
  int k;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  iVar1 = *num_regions;
  if (0 < iVar1) {
    uVar2 = 0;
    do {
      if ((((int)uVar2 < 1) ||
          (regions[(ulong)uVar2 - 1].type != regions[uVar2].type ||
           regions[uVar2].type == SCENECUT_REGION)) &&
         (regions[(int)uVar2].start <= regions[(int)uVar2].last)) {
        uVar2 = uVar2 + 1;
        uStack_28 = CONCAT44(uVar2,(undefined4)uStack_28);
      }
      else {
        remove_region(0,regions,num_regions,(int *)((long)&uStack_28 + 4));
        iVar1 = *num_regions;
        uVar2 = uStack_28._4_4_;
      }
    } while ((int)uVar2 < iVar1);
  }
  return;
}

Assistant:

static void cleanup_regions(REGIONS *regions, int *num_regions) {
  int k = 0;
  while (k < *num_regions) {
    if ((k > 0 && regions[k - 1].type == regions[k].type &&
         regions[k].type != SCENECUT_REGION) ||
        regions[k].last < regions[k].start) {
      remove_region(0, regions, num_regions, &k);
    } else {
      k++;
    }
  }
}